

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

float diff_t(float (*floatpic) [512] [512],float *kernel,int x,int y,int n)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  
  if (-1 < n) {
    pfVar1 = floatpic[2 - (long)n][x] + y;
    fVar3 = 0.0;
    lVar2 = 0;
    do {
      fVar3 = fVar3 + kernel[(lVar2 + 2) - (long)n] * *pfVar1;
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 0x40000;
    } while (n * 2 + 1 != (int)lVar2);
    return fVar3;
  }
  return 0.0;
}

Assistant:

float diff_t(
float floatpic[PIC_T][PIC_X][PIC_Y],
float kernel[5],
int x, int y, int n)
{
int i;
float sum;

sum = 0.0;
for(i=(-n);i<=n;i++)
	{
	sum += kernel[i+2]*floatpic[2+i][x][y];
	}
return(sum);
}